

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  bool bVar1;
  bool bVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  size_t _var_err__;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint *count;
  long lVar9;
  byte bVar10;
  BYTE *pBVar11;
  size_t sVar12;
  uint maxSymbolValue_local;
  HUF_CElt *local_58;
  uint *local_50;
  BYTE *local_48;
  uint local_3c;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  
  uVar7 = (ulong)(-(int)workSpace & 7);
  count = (uint *)((long)workSpace + uVar7);
  puVar3 = (uint *)(wkspSize - uVar7);
  if (wkspSize < uVar7) {
    count = (uint *)0x0;
    puVar3 = (uint *)0x0;
  }
  if (puVar3 < (uint *)0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  sVar12 = 0xffffffffffffffd2;
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_3c = 0xb;
  if (huffLog != 0) {
    local_3c = huffLog;
  }
  local_48 = (BYTE *)((long)dst + dstSize);
  bVar10 = repeat != (HUF_repeat *)0x0 & (byte)((flags & 4U) >> 2);
  if ((bVar10 == 1) && (*repeat == HUF_repeat_valid)) {
    sVar12 = HUF_compressCTable_internal
                       ((BYTE *)dst,(BYTE *)dst,local_48,src,srcSize,nbStreams,oldHufTable,flags);
    return sVar12;
  }
  local_58 = (HUF_CElt *)CONCAT71(local_58._1_7_,bVar10);
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    maxSymbolValueBegin = maxSymbolValue_local;
    uVar4 = HIST_count_simple(count,&maxSymbolValueBegin,src,0x1000);
    sVar12 = (size_t)uVar4;
    maxSymbolValueEnd = maxSymbolValue_local;
    uVar4 = HIST_count_simple(count,&maxSymbolValueEnd,(void *)((long)src + (srcSize - 0x1000)),
                              0x1000);
    if (uVar4 + sVar12 < 0x45) {
      return 0;
    }
  }
  local_50 = count + 0x302;
  sVar6 = HIST_count_wksp(count,&maxSymbolValue_local,src,srcSize,local_50,0x1000);
  if (sVar6 < 0xffffffffffffff89) {
    if (sVar6 == srcSize) {
      *(undefined1 *)dst = *src;
      bVar2 = false;
      sVar6 = 1;
    }
    else {
      uVar7 = (srcSize >> 7) + 4;
      bVar2 = uVar7 < sVar6;
      bVar1 = sVar6 <= uVar7;
      sVar6 = sVar12;
      if (bVar1) {
        sVar6 = 0;
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    return sVar6;
  }
  if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) &&
     (iVar5 = HUF_validateCTable(oldHufTable,count,maxSymbolValue_local), iVar5 == 0)) {
    *repeat = HUF_repeat_none;
  }
  pBVar11 = (BYTE *)dst;
  if (((char)local_58 != '\0') && (*repeat != HUF_repeat_none)) goto LAB_0038383e;
  local_58 = (HUF_CElt *)(count + 0x100);
  uVar4 = HUF_optimalTableLog(local_3c,srcSize,maxSymbolValue_local,local_50,0x1300,local_58,count,
                              flags);
  sVar12 = HUF_buildCTable_wksp(local_58,count,maxSymbolValue_local,uVar4,local_50,0x1300);
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  sVar12 = HUF_writeCTable_wksp
                     (dst,dstSize,local_58,maxSymbolValue_local,(uint)sVar12,local_50,0x2ec);
  if (sVar12 < 0xffffffffffffff89) {
    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
      if ((int)maxSymbolValue_local < 0) {
        uVar7 = 0;
      }
      else {
        lVar9 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (ulong)count[lVar9] * (ulong)(byte)oldHufTable[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar9);
        uVar7 = uVar7 >> 3;
      }
      if ((int)maxSymbolValue_local < 0) {
        uVar8 = 0;
      }
      else {
        lVar9 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + (ulong)count[lVar9] * (ulong)(byte)count[lVar9 * 2 + 0x102];
          lVar9 = lVar9 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar9);
        uVar8 = uVar8 >> 3;
      }
      if (srcSize <= sVar12 + 0xc || uVar7 <= uVar8 + sVar12) {
        sVar12 = HUF_compressCTable_internal
                           ((BYTE *)dst,(BYTE *)dst,local_48,src,srcSize,nbStreams,oldHufTable,flags
                           );
        goto LAB_00383734;
      }
    }
    if (sVar12 + 0xc < srcSize) {
      if (repeat != (HUF_repeat *)0x0) {
        *repeat = HUF_repeat_none;
      }
      pBVar11 = (BYTE *)(sVar12 + (long)dst);
      bVar2 = true;
      sVar12 = sVar6;
      if (oldHufTable != (HUF_CElt *)0x0) {
        switchD_00337d4d::default(oldHufTable,local_58,0x808);
      }
    }
    else {
      bVar2 = false;
      sVar12 = 0;
    }
  }
  else {
LAB_00383734:
    bVar2 = false;
  }
  oldHufTable = local_58;
  if (!bVar2) {
    return sVar12;
  }
LAB_0038383e:
  sVar12 = HUF_compressCTable_internal
                     ((BYTE *)dst,pBVar11,local_48,src,srcSize,nbStreams,oldHufTable,flags);
  return sVar12;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}